

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
llvm::
SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
::grow(SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
       *this,uint AtLeast)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  DenseSetPair<unsigned_short> *pDVar4;
  ulong uVar5;
  LargeRep LVar6;
  DenseSetPair<unsigned_short> local_28 [4];
  AlignedCharArrayUnion<llvm::detail::DenseSetPair<unsigned_short>[4]> TmpStorage;
  
  if (3 < AtLeast) {
    uVar2 = AtLeast - 1 >> 1 | AtLeast - 1;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar2 = (uVar2 >> 0x10 | uVar2) + 1;
    AtLeast = 0x40;
    if (0x40 < uVar2) {
      AtLeast = uVar2;
    }
  }
  if ((*(uint *)this & 1) == 0) {
    pDVar4 = *(DenseSetPair<unsigned_short> **)(this->storage).buffer;
    uVar5 = (ulong)*(uint *)((this->storage).buffer + 8);
    if (AtLeast < 5) {
      *(uint *)this = *(uint *)this | 1;
    }
    else {
      LVar6 = allocateBuckets(this,AtLeast);
      *(DenseSetPair<unsigned_short> **)(this->storage).buffer = LVar6.Buckets;
      *(uint *)((this->storage).buffer + 8) = LVar6.NumBuckets;
    }
    DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
    ::moveFromOldBuckets
              ((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                *)this,pDVar4,pDVar4 + uVar5);
    operator_delete(pDVar4,uVar5 * 2,2);
    return;
  }
  if (3 < AtLeast) {
    lVar3 = 8;
    pDVar4 = local_28;
    do {
      uVar1 = *(ushort *)((this->storage).buffer + lVar3 + -8);
      if (uVar1 < 0xfffe) {
        if (7 < (ulong)((long)pDVar4 - (long)local_28)) {
          __assert_fail("size_t(TmpEnd - TmpBegin) < InlineBuckets && \"Too many inline buckets!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                        ,0x405,
                        "void llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>::grow(unsigned int) [KeyT = unsigned short, ValueT = llvm::detail::DenseSetEmpty, InlineBuckets = 4, KeyInfoT = llvm::DenseMapInfo<unsigned short>, BucketT = llvm::detail::DenseSetPair<unsigned short>]"
                       );
        }
        pDVar4->key = uVar1;
        pDVar4 = pDVar4 + 1;
      }
      lVar3 = lVar3 + 2;
    } while (lVar3 != 0x10);
    *(byte *)this = *(byte *)this & 0xfe;
    LVar6 = allocateBuckets(this,AtLeast);
    *(DenseSetPair<unsigned_short> **)(this->storage).buffer = LVar6.Buckets;
    *(uint *)((this->storage).buffer + 8) = LVar6.NumBuckets;
    DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
    ::moveFromOldBuckets
              ((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                *)this,local_28,pDVar4);
  }
  return;
}

Assistant:

void grow(unsigned AtLeast) {
    if (AtLeast >= InlineBuckets)
      AtLeast = std::max<unsigned>(64, NextPowerOf2(AtLeast-1));

    if (Small) {
      if (AtLeast < InlineBuckets)
        return; // Nothing to do.

      // First move the inline buckets into a temporary storage.
      AlignedCharArrayUnion<BucketT[InlineBuckets]> TmpStorage;
      BucketT *TmpBegin = reinterpret_cast<BucketT *>(TmpStorage.buffer);
      BucketT *TmpEnd = TmpBegin;

      // Loop over the buckets, moving non-empty, non-tombstones into the
      // temporary storage. Have the loop move the TmpEnd forward as it goes.
      const KeyT EmptyKey = this->getEmptyKey();
      const KeyT TombstoneKey = this->getTombstoneKey();
      for (BucketT *P = getBuckets(), *E = P + InlineBuckets; P != E; ++P) {
        if (!KeyInfoT::isEqual(P->getFirst(), EmptyKey) &&
            !KeyInfoT::isEqual(P->getFirst(), TombstoneKey)) {
          assert(size_t(TmpEnd - TmpBegin) < InlineBuckets &&
                 "Too many inline buckets!");
          ::new (&TmpEnd->getFirst()) KeyT(std::move(P->getFirst()));
          ::new (&TmpEnd->getSecond()) ValueT(std::move(P->getSecond()));
          ++TmpEnd;
          P->getSecond().~ValueT();
        }
        P->getFirst().~KeyT();
      }

      // Now make this map use the large rep, and move all the entries back
      // into it.
      Small = false;
      new (getLargeRep()) LargeRep(allocateBuckets(AtLeast));
      this->moveFromOldBuckets(TmpBegin, TmpEnd);
      return;
    }

    LargeRep OldRep = std::move(*getLargeRep());
    getLargeRep()->~LargeRep();
    if (AtLeast <= InlineBuckets) {
      Small = true;
    } else {
      new (getLargeRep()) LargeRep(allocateBuckets(AtLeast));
    }

    this->moveFromOldBuckets(OldRep.Buckets, OldRep.Buckets+OldRep.NumBuckets);

    // Free the old table.
    deallocate_buffer(OldRep.Buckets, sizeof(BucketT) * OldRep.NumBuckets,
                      alignof(BucketT));
  }